

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fUniformApiTests.cpp
# Opt level: O3

void __thiscall
deqp::gles3::Functional::anon_unknown_1::UniformCollection::addUniform
          (UniformCollection *this,Uniform *uniform)

{
  pointer *ppUVar1;
  Uniform *__last;
  Uniform *__first;
  pointer pcVar2;
  allocator<deqp::gles3::Functional::(anonymous_namespace)::Uniform> *paVar3;
  pointer __result;
  Uniform *pUVar4;
  allocator<deqp::gles3::Functional::(anonymous_namespace)::Uniform> *__alloc;
  Uniform *in_RDX;
  Uniform *__args;
  long lVar5;
  allocator<deqp::gles3::Functional::(anonymous_namespace)::Uniform> *this_00;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar6;
  Uniform *pUVar7;
  
  __last = (this->m_uniforms).
           super__Vector_base<deqp::gles3::Functional::(anonymous_namespace)::Uniform,_std::allocator<deqp::gles3::Functional::(anonymous_namespace)::Uniform>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if (__last == (this->m_uniforms).
                super__Vector_base<deqp::gles3::Functional::(anonymous_namespace)::Uniform,_std::allocator<deqp::gles3::Functional::(anonymous_namespace)::Uniform>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage) {
    __first = (this->m_uniforms).
              super__Vector_base<deqp::gles3::Functional::(anonymous_namespace)::Uniform,_std::allocator<deqp::gles3::Functional::(anonymous_namespace)::Uniform>_>
              ._M_impl.super__Vector_impl_data._M_start;
    lVar5 = (long)__last - (long)__first;
    if (lVar5 == 0x7ffffffffffffff8) {
      std::__throw_length_error("vector::_M_realloc_insert");
    }
    __alloc = (allocator<deqp::gles3::Functional::(anonymous_namespace)::Uniform> *)
              ((lVar5 >> 3) * 0x6db6db6db6db6db7);
    paVar3 = (allocator<deqp::gles3::Functional::(anonymous_namespace)::Uniform> *)&DAT_00000001;
    if (__last != __first) {
      paVar3 = __alloc;
    }
    this_00 = paVar3 + (long)__alloc;
    if ((allocator<deqp::gles3::Functional::(anonymous_namespace)::Uniform> *)0x249249249249248 <
        this_00) {
      this_00 = (allocator<deqp::gles3::Functional::(anonymous_namespace)::Uniform> *)
                0x249249249249249;
    }
    if (CARRY8((ulong)paVar3,(ulong)__alloc)) {
      this_00 = (allocator<deqp::gles3::Functional::(anonymous_namespace)::Uniform> *)
                0x249249249249249;
    }
    __result = std::
               _Vector_base<deqp::gles3::Functional::(anonymous_namespace)::Uniform,_std::allocator<deqp::gles3::Functional::(anonymous_namespace)::Uniform>_>
               ::_M_allocate((_Vector_base<deqp::gles3::Functional::(anonymous_namespace)::Uniform,_std::allocator<deqp::gles3::Functional::(anonymous_namespace)::Uniform>_>
                              *)this_00,(size_t)uniform);
    std::allocator_traits<std::allocator<deqp::gles3::Functional::(anonymous_namespace)::Uniform>>::
    construct<deqp::gles3::Functional::(anonymous_namespace)::Uniform,deqp::gles3::Functional::(anonymous_namespace)::Uniform_const&>
              ((allocator_type *)(lVar5 + (long)__result),uniform,__args);
    pUVar4 = std::
             __uninitialized_move_if_noexcept_a<deqp::gles3::Functional::(anonymous_namespace)::Uniform*,deqp::gles3::Functional::(anonymous_namespace)::Uniform*,std::allocator<deqp::gles3::Functional::(anonymous_namespace)::Uniform>>
                       (__first,__last,__result,__alloc);
    if (__last != __first) {
      paVar6 = &(__first->name).field_2;
      do {
        glu::VarType::~VarType((VarType *)(paVar6 + 1));
        pcVar2 = (((string *)(paVar6 + -1))->_M_dataplus)._M_p;
        if (paVar6 != (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)pcVar2) {
          operator_delete(pcVar2,paVar6->_M_allocated_capacity + 1);
        }
        pUVar7 = (Uniform *)((long)paVar6 + 0x28);
        paVar6 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                  *)((long)paVar6 + 0x38);
      } while (pUVar7 != __last);
    }
    if (__first != (Uniform *)0x0) {
      operator_delete(__first,(long)(this->m_uniforms).
                                    super__Vector_base<deqp::gles3::Functional::(anonymous_namespace)::Uniform,_std::allocator<deqp::gles3::Functional::(anonymous_namespace)::Uniform>_>
                                    ._M_impl.super__Vector_impl_data._M_end_of_storage -
                              (long)__first);
    }
    (this->m_uniforms).
    super__Vector_base<deqp::gles3::Functional::(anonymous_namespace)::Uniform,_std::allocator<deqp::gles3::Functional::(anonymous_namespace)::Uniform>_>
    ._M_impl.super__Vector_impl_data._M_start = __result;
    (this->m_uniforms).
    super__Vector_base<deqp::gles3::Functional::(anonymous_namespace)::Uniform,_std::allocator<deqp::gles3::Functional::(anonymous_namespace)::Uniform>_>
    ._M_impl.super__Vector_impl_data._M_finish = pUVar4 + 1;
    (this->m_uniforms).
    super__Vector_base<deqp::gles3::Functional::(anonymous_namespace)::Uniform,_std::allocator<deqp::gles3::Functional::(anonymous_namespace)::Uniform>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = __result + (long)this_00;
  }
  else {
    std::allocator_traits<std::allocator<deqp::gles3::Functional::(anonymous_namespace)::Uniform>>::
    construct<deqp::gles3::Functional::(anonymous_namespace)::Uniform,deqp::gles3::Functional::(anonymous_namespace)::Uniform_const&>
              ((allocator_type *)__last,uniform,in_RDX);
    ppUVar1 = &(this->m_uniforms).
               super__Vector_base<deqp::gles3::Functional::(anonymous_namespace)::Uniform,_std::allocator<deqp::gles3::Functional::(anonymous_namespace)::Uniform>_>
               ._M_impl.super__Vector_impl_data._M_finish;
    *ppUVar1 = *ppUVar1 + 1;
  }
  return;
}

Assistant:

void				addUniform			(const Uniform& uniform)		{ m_uniforms.push_back(uniform);	}